

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

int __thiscall re2::Prog::ComputeFirstByte(Prog *this)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  Inst *pIVar5;
  _Head_base<0UL,_int_*,_false> _Var6;
  uint uVar7;
  int iVar8;
  long lVar9;
  SparseSet q;
  uint local_1dc;
  SparseSetT<void> local_1d8;
  LogMessage local_1b0;
  
  SparseSetT<void>::SparseSetT(&local_1d8,this->size_);
  SparseSetT<void>::InsertInternal(&local_1d8,true,this->start_);
  if (local_1d8.size_ != 0) {
    iVar8 = *local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
             .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    lVar9 = (long)iVar8;
    pIVar5 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar7 = pIVar5[lVar9].out_opcode_;
    bVar2 = false;
    local_1dc = 0xffffffff;
    _Var6._M_head_impl =
         local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
         super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    uVar3 = local_1dc;
    switch(uVar7 & 7) {
    case 0:
      goto switchD_001cb5e0_caseD_0;
    case 1:
      goto switchD_001cb5e0_caseD_1;
    case 2:
      goto switchD_001cb5e0_caseD_2;
    default:
      goto switchD_001cb5e0_caseD_3;
    case 5:
      goto switchD_001cb5e0_caseD_5;
    case 7:
      goto switchD_001cb5e0_caseD_7;
    }
  }
LAB_001cb72c:
  local_1dc = 0xffffffff;
LAB_001cb737:
  SparseSetT<void>::~SparseSetT(&local_1d8);
  return local_1dc;
switchD_001cb5e0_caseD_0:
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
             ,0x272);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"unhandled ",10);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar5[lVar9].out_opcode_ & 7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ComputeFirstByte",0x14);
  LogMessage::~LogMessage(&local_1b0);
  uVar3 = local_1dc;
switchD_001cb5e0_caseD_7:
  local_1dc = uVar3;
  bVar2 = true;
switchD_001cb5e0_caseD_5:
  if (!bVar2) goto LAB_001cb72c;
  _Var6._M_head_impl = _Var6._M_head_impl + 1;
  if (_Var6._M_head_impl ==
      local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl + local_1d8.size_) goto LAB_001cb737;
  iVar8 = *_Var6._M_head_impl;
  lVar9 = (long)iVar8;
  pIVar5 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
           super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
  uVar7 = pIVar5[lVar9].out_opcode_;
  bVar2 = false;
  uVar3 = local_1dc;
  switch(uVar7 & 7) {
  case 0:
    goto switchD_001cb5e0_caseD_0;
  case 1:
    goto switchD_001cb5e0_caseD_1;
  case 2:
switchD_001cb5e0_caseD_2:
    if ((uVar7 & 8) == 0) {
      SparseSetT<void>::InsertInternal(&local_1d8,true,(int)lVar9 + 1);
    }
    bVar1 = pIVar5[lVar9].field_1.field_3.lo_;
    bVar2 = false;
    if (((bVar1 == pIVar5[lVar9].field_1.field_3.hi_) &&
        ((0x19 < (byte)(bVar1 + 0x9f) ||
         (bVar2 = false, (pIVar5[lVar9].field_1.field_3.hint_foldcase_ & 1) == 0)))) &&
       ((uVar3 = (uint)bVar1, local_1dc == 0xffffffff ||
        (bVar2 = false, uVar3 = local_1dc, local_1dc == bVar1)))) goto switchD_001cb5e0_caseD_7;
    goto switchD_001cb5e0_caseD_5;
  default:
    break;
  case 5:
    goto switchD_001cb5e0_caseD_5;
  case 7:
    goto switchD_001cb5e0_caseD_7;
  }
switchD_001cb5e0_caseD_3:
  if ((uVar7 & 8) == 0) {
    SparseSetT<void>::InsertInternal(&local_1d8,true,(int)lVar9 + 1);
  }
  uVar3 = local_1dc;
  if (pIVar5[lVar9].out_opcode_ < 0x10) goto switchD_001cb5e0_caseD_7;
  uVar7 = pIVar5[lVar9].out_opcode_ >> 4;
LAB_001cb658:
  SparseSetT<void>::InsertInternal(&local_1d8,true,uVar7);
  uVar3 = local_1dc;
  goto switchD_001cb5e0_caseD_7;
switchD_001cb5e0_caseD_1:
  uVar7 = iVar8 + 1;
  goto LAB_001cb658;
}

Assistant:

int Prog::ComputeFirstByte() {
  int b = -1;
  SparseSet q(size());
  q.insert(start());
  for (SparseSet::iterator it = q.begin(); it != q.end(); ++it) {
    int id = *it;
    Prog::Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled " << ip->opcode() << " in ComputeFirstByte";
        break;

      case kInstMatch:
        // The empty string matches: no first byte.
        return -1;

      case kInstByteRange:
        if (!ip->last())
          q.insert(id+1);

        // Must match only a single byte
        if (ip->lo() != ip->hi())
          return -1;
        if (ip->foldcase() && 'a' <= ip->lo() && ip->lo() <= 'z')
          return -1;
        // If we haven't seen any bytes yet, record it;
        // otherwise must match the one we saw before.
        if (b == -1)
          b = ip->lo();
        else if (b != ip->lo())
          return -1;
        break;

      case kInstNop:
      case kInstCapture:
      case kInstEmptyWidth:
        if (!ip->last())
          q.insert(id+1);

        // Continue on.
        // Ignore ip->empty() flags for kInstEmptyWidth
        // in order to be as conservative as possible
        // (assume all possible empty-width flags are true).
        if (ip->out())
          q.insert(ip->out());
        break;

      case kInstAltMatch:
        DCHECK(!ip->last());
        q.insert(id+1);
        break;

      case kInstFail:
        break;
    }
  }
  return b;
}